

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

bool __thiscall
jrtplib::RTPUDPv6Transmitter::ShouldAcceptData
          (RTPUDPv6Transmitter *this,in6_addr srcip,uint16_t srcport)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar1;
  ReceiveMode RVar2;
  PortInfo *pPVar3;
  HashElement *pHVar4;
  _List_node_base *p_Var5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  in6_addr srcip_local;
  
  srcip_local.__in6_u.__u6_addr32[3] = srcip.__in6_u._12_4_;
  RVar2 = this->receivemode;
  pHVar4 = (this->acceptignoreinfo).table
           [(srcip_local.__in6_u.__u6_addr32[3] >> 0x18 |
             (srcip_local.__in6_u.__u6_addr32[3] & 0xff0000) >> 8 |
             (srcip_local.__in6_u.__u6_addr32[3] & 0xff00) << 8 |
            srcip_local.__in6_u.__u6_addr32[3] << 0x18) % 0x207d];
  (this->acceptignoreinfo).curhashelem = pHVar4;
  srcip_local.__in6_u.__u6_addr8[8] = srcip.__in6_u._8_1_;
  srcip_local.__in6_u.__u6_addr8[9] = srcip.__in6_u._9_1_;
  srcip_local.__in6_u.__u6_addr8[10] = srcip.__in6_u._10_1_;
  srcip_local.__in6_u.__u6_addr8[0xb] = srcip.__in6_u._11_1_;
  srcip_local.__in6_u.__u6_addr8[0xc] = srcip.__in6_u._12_1_;
  srcip_local.__in6_u.__u6_addr8[0xd] = srcip.__in6_u._13_1_;
  srcip_local.__in6_u.__u6_addr8[0xe] = srcip.__in6_u._14_1_;
  srcip_local.__in6_u.__u6_addr8[0xf] = srcip.__in6_u._15_1_;
  srcip_local.__in6_u.__u6_addr8[0] = srcip.__in6_u._0_1_;
  srcip_local.__in6_u.__u6_addr8[1] = srcip.__in6_u._1_1_;
  srcip_local.__in6_u.__u6_addr8[2] = srcip.__in6_u._2_1_;
  srcip_local.__in6_u.__u6_addr8[3] = srcip.__in6_u._3_1_;
  srcip_local.__in6_u.__u6_addr8[4] = srcip.__in6_u._4_1_;
  srcip_local.__in6_u.__u6_addr8[5] = srcip.__in6_u._5_1_;
  srcip_local.__in6_u.__u6_addr8[6] = srcip.__in6_u._6_1_;
  srcip_local.__in6_u.__u6_addr8[7] = srcip.__in6_u._7_1_;
  if (RVar2 == AcceptSome) {
    bVar6 = false;
    do {
      if (pHVar4 == (HashElement *)0x0) break;
      auVar7[0] = -(srcip_local.__in6_u.__u6_addr8[0] == (pHVar4->key).__in6_u.__u6_addr8[0]);
      auVar7[1] = -(srcip_local.__in6_u.__u6_addr8[1] == (pHVar4->key).__in6_u.__u6_addr8[1]);
      auVar7[2] = -(srcip_local.__in6_u.__u6_addr8[2] == (pHVar4->key).__in6_u.__u6_addr8[2]);
      auVar7[3] = -(srcip_local.__in6_u.__u6_addr8[3] == (pHVar4->key).__in6_u.__u6_addr8[3]);
      auVar7[4] = -(srcip_local.__in6_u.__u6_addr8[4] == (pHVar4->key).__in6_u.__u6_addr8[4]);
      auVar7[5] = -(srcip_local.__in6_u.__u6_addr8[5] == (pHVar4->key).__in6_u.__u6_addr8[5]);
      auVar7[6] = -(srcip_local.__in6_u.__u6_addr8[6] == (pHVar4->key).__in6_u.__u6_addr8[6]);
      auVar7[7] = -(srcip_local.__in6_u.__u6_addr8[7] == (pHVar4->key).__in6_u.__u6_addr8[7]);
      auVar7[8] = -(srcip_local.__in6_u.__u6_addr8[8] == (pHVar4->key).__in6_u.__u6_addr8[8]);
      auVar7[9] = -(srcip_local.__in6_u.__u6_addr8[9] == (pHVar4->key).__in6_u.__u6_addr8[9]);
      auVar7[10] = -(srcip_local.__in6_u.__u6_addr8[10] == (pHVar4->key).__in6_u.__u6_addr8[10]);
      auVar7[0xb] = -(srcip_local.__in6_u.__u6_addr8[0xb] == (pHVar4->key).__in6_u.__u6_addr8[0xb]);
      auVar7[0xc] = -(srcip_local.__in6_u.__u6_addr8[0xc] == (pHVar4->key).__in6_u.__u6_addr8[0xc]);
      auVar7[0xd] = -(srcip_local.__in6_u.__u6_addr8[0xd] == (pHVar4->key).__in6_u.__u6_addr8[0xd]);
      auVar7[0xe] = -(srcip_local.__in6_u.__u6_addr8[0xe] == (pHVar4->key).__in6_u.__u6_addr8[0xe]);
      auVar7[0xf] = -(srcip_local.__in6_u.__u6_addr8[0xf] == (pHVar4->key).__in6_u.__u6_addr8[0xf]);
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        bVar6 = true;
      }
      else {
        pHVar4 = pHVar4->hashnext;
        (this->acceptignoreinfo).curhashelem = pHVar4;
      }
    } while (!bVar6);
    pHVar4 = (this->acceptignoreinfo).curhashelem;
    if (pHVar4 == (HashElement *)0x0) {
      return false;
    }
    pPVar3 = pHVar4->element;
    plVar1 = &pPVar3->portlist;
    p_Var5 = (_List_node_base *)plVar1;
    if (pPVar3->all == false) {
      do {
        p_Var5 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var5->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar6 = p_Var5 != (_List_node_base *)plVar1;
        if (p_Var5 == (_List_node_base *)plVar1) {
          return bVar6;
        }
      } while (*(uint16_t *)&p_Var5[1]._M_next != srcport);
    }
    else {
      do {
        p_Var5 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var5->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar6 = p_Var5 == (_List_node_base *)plVar1;
        if (bVar6) {
          return bVar6;
        }
      } while (*(uint16_t *)&p_Var5[1]._M_next != srcport);
    }
  }
  else {
    bVar6 = false;
    do {
      if (pHVar4 == (HashElement *)0x0) break;
      auVar8[0] = -(srcip_local.__in6_u.__u6_addr8[0] == (pHVar4->key).__in6_u.__u6_addr8[0]);
      auVar8[1] = -(srcip_local.__in6_u.__u6_addr8[1] == (pHVar4->key).__in6_u.__u6_addr8[1]);
      auVar8[2] = -(srcip_local.__in6_u.__u6_addr8[2] == (pHVar4->key).__in6_u.__u6_addr8[2]);
      auVar8[3] = -(srcip_local.__in6_u.__u6_addr8[3] == (pHVar4->key).__in6_u.__u6_addr8[3]);
      auVar8[4] = -(srcip_local.__in6_u.__u6_addr8[4] == (pHVar4->key).__in6_u.__u6_addr8[4]);
      auVar8[5] = -(srcip_local.__in6_u.__u6_addr8[5] == (pHVar4->key).__in6_u.__u6_addr8[5]);
      auVar8[6] = -(srcip_local.__in6_u.__u6_addr8[6] == (pHVar4->key).__in6_u.__u6_addr8[6]);
      auVar8[7] = -(srcip_local.__in6_u.__u6_addr8[7] == (pHVar4->key).__in6_u.__u6_addr8[7]);
      auVar8[8] = -(srcip_local.__in6_u.__u6_addr8[8] == (pHVar4->key).__in6_u.__u6_addr8[8]);
      auVar8[9] = -(srcip_local.__in6_u.__u6_addr8[9] == (pHVar4->key).__in6_u.__u6_addr8[9]);
      auVar8[10] = -(srcip_local.__in6_u.__u6_addr8[10] == (pHVar4->key).__in6_u.__u6_addr8[10]);
      auVar8[0xb] = -(srcip_local.__in6_u.__u6_addr8[0xb] == (pHVar4->key).__in6_u.__u6_addr8[0xb]);
      auVar8[0xc] = -(srcip_local.__in6_u.__u6_addr8[0xc] == (pHVar4->key).__in6_u.__u6_addr8[0xc]);
      auVar8[0xd] = -(srcip_local.__in6_u.__u6_addr8[0xd] == (pHVar4->key).__in6_u.__u6_addr8[0xd]);
      auVar8[0xe] = -(srcip_local.__in6_u.__u6_addr8[0xe] == (pHVar4->key).__in6_u.__u6_addr8[0xe]);
      auVar8[0xf] = -(srcip_local.__in6_u.__u6_addr8[0xf] == (pHVar4->key).__in6_u.__u6_addr8[0xf]);
      if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        bVar6 = true;
      }
      else {
        pHVar4 = pHVar4->hashnext;
        (this->acceptignoreinfo).curhashelem = pHVar4;
      }
    } while (!bVar6);
    pHVar4 = (this->acceptignoreinfo).curhashelem;
    if (pHVar4 == (HashElement *)0x0) {
      return true;
    }
    pPVar3 = pHVar4->element;
    plVar1 = &pPVar3->portlist;
    p_Var5 = (_List_node_base *)plVar1;
    if (pPVar3->all == false) {
      do {
        p_Var5 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var5->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar6 = p_Var5 == (_List_node_base *)plVar1;
        if (bVar6) {
          return bVar6;
        }
      } while (*(uint16_t *)&p_Var5[1]._M_next != srcport);
    }
    else {
      do {
        p_Var5 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var5->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar6 = p_Var5 != (_List_node_base *)plVar1;
        if (p_Var5 == (_List_node_base *)plVar1) {
          return bVar6;
        }
      } while (*(uint16_t *)&p_Var5[1]._M_next != srcport);
    }
  }
  return bVar6;
}

Assistant:

bool RTPUDPv6Transmitter::ShouldAcceptData(in6_addr srcip,uint16_t srcport)
{
	if (receivemode == RTPTransmitter::AcceptSome)
	{
		PortInfo *inf;

		acceptignoreinfo.GotoElement(srcip);
		if (!acceptignoreinfo.HasCurrentElement())
			return false;
		
		inf = acceptignoreinfo.GetCurrentElement();
		if (!inf->all) // only accept the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return true;
			}
			return false;
		}
		else // accept all, except the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return false;
			}
			return true;
		}
	}
	else // IgnoreSome
	{
		PortInfo *inf;

		acceptignoreinfo.GotoElement(srcip);
		if (!acceptignoreinfo.HasCurrentElement())
			return true;
		
		inf = acceptignoreinfo.GetCurrentElement();
		if (!inf->all) // ignore the ports in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return false;
			}
			return true;
		}
		else // ignore all, except the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return true;
			}
			return false;
		}
	}
	return true;
}